

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_buf_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                    _Bool *peos)

{
  void *pvVar1;
  size_t local_48;
  size_t nread;
  cr_buf_ctx *ctx;
  _Bool *peos_local;
  size_t *pnread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  local_48 = *(long *)((long)pvVar1 + 0x28) - *(long *)((long)pvVar1 + 0x30);
  if ((local_48 == 0) || (*(long *)((long)pvVar1 + 0x20) == 0)) {
    *pnread = 0;
    *peos = true;
  }
  else {
    if (blen < local_48) {
      local_48 = blen;
    }
    memcpy(buf,(void *)(*(long *)((long)pvVar1 + 0x20) + *(long *)((long)pvVar1 + 0x30)),local_48);
    *pnread = local_48;
    *(size_t *)((long)pvVar1 + 0x30) = local_48 + *(long *)((long)pvVar1 + 0x30);
    *peos = *(long *)((long)pvVar1 + 0x30) == *(long *)((long)pvVar1 + 0x28);
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_buf_read(len=%zu) -> 0, nread=%zu, eos=%d",blen,*pnread,
                  (ulong)(*peos & 1));
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_buf_read(struct Curl_easy *data,
                            struct Curl_creader *reader,
                            char *buf, size_t blen,
                            size_t *pnread, bool *peos)
{
  struct cr_buf_ctx *ctx = reader->ctx;
  size_t nread = ctx->blen - ctx->index;

  (void)data;
  if(!nread || !ctx->buf) {
    *pnread = 0;
    *peos = TRUE;
  }
  else {
    if(nread > blen)
      nread = blen;
    memcpy(buf, ctx->buf + ctx->index, nread);
    *pnread = nread;
    ctx->index += nread;
    *peos = (ctx->index == ctx->blen);
  }
  CURL_TRC_READ(data, "cr_buf_read(len=%zu) -> 0, nread=%zu, eos=%d",
                blen, *pnread, *peos);
  return CURLE_OK;
}